

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

int FsFindClose(HANDLE Hdl)

{
  pResources pRes;
  HANDLE Hdl_local;
  
  if (Hdl != (HANDLE)0x0) {
    if ((*(long *)((long)Hdl + 8) != 0) && (*(void **)((long)Hdl + 8) != (void *)0x0)) {
      operator_delete__(*(void **)((long)Hdl + 8));
    }
    if (Hdl != (HANDLE)0x0) {
      operator_delete(Hdl,0x10);
    }
  }
  return 0;
}

Assistant:

int DCPCALL FsFindClose(HANDLE Hdl){
    pResources pRes = (pResources) Hdl;
    if(pRes){
        if(pRes->resource_array)
            delete[] pRes->resource_array;

        delete pRes;
    }

    return 0;
}